

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int print_mixw(char *fn)

{
  int iVar1;
  cmd_ln_t *pcVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  double dVar8;
  uint32 n_density;
  uint32 n_feat;
  uint32 n_mixw;
  double local_50;
  float32 ***mixw;
  ulong local_40;
  long local_38;
  
  pcVar2 = cmd_ln_get();
  local_38 = cmd_ln_int_r(pcVar2,"-norm");
  pcVar6 = "and normalizing.";
  if ((int)local_38 == 0) {
    pcVar6 = ".";
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
          ,0x1a5,"Reading %s%s\n",fn,pcVar6);
  pcVar2 = cmd_ln_get();
  pcVar6 = cmd_ln_str_r(pcVar2,"-mixws");
  uVar4 = 0xffffffffffffffff;
  uVar3 = 0xffffffff;
  if (pcVar6 != (char *)0x0) {
    pcVar2 = cmd_ln_get();
    uVar3 = cmd_ln_int_r(pcVar2,"-mixws");
  }
  pcVar2 = cmd_ln_get();
  pcVar6 = cmd_ln_str_r(pcVar2,"-mixwe");
  if (pcVar6 != (char *)0x0) {
    pcVar2 = cmd_ln_get();
    uVar4 = cmd_ln_int_r(pcVar2,"-mixwe");
  }
  uVar7 = (uint)uVar3;
  if ((uVar7 & (uint)uVar4) == 0xffffffff) {
    iVar1 = s3mixw_read(fn,&mixw,&n_mixw,&n_feat,&n_density);
    if (iVar1 != 0) {
      return -1;
    }
    printf("mixw %u %u %u\n",(ulong)n_mixw,(ulong)n_feat,(ulong)n_density);
  }
  else {
    iVar1 = s3mixw_intv_read(fn,uVar7,(uint)uVar4,&mixw,&n_mixw,&n_feat,&n_density);
    if (iVar1 != 0) {
      return -1;
    }
    printf("mixw %u %u %u subinterval [%u %u]\n",(ulong)n_mixw,(ulong)n_feat,(ulong)n_density,
           uVar3 & 0xffffffff,uVar4 & 0xffffffff);
  }
  local_40 = uVar3 & 0xffffffff;
  if (uVar7 == 0xffffffff) {
    local_40 = 0;
  }
  for (uVar4 = 0; uVar4 < n_mixw; uVar4 = uVar4 + 1) {
    uVar7 = (int)local_40 + (int)uVar4;
    for (uVar3 = 0; uVar3 < n_feat; uVar3 = uVar3 + 1) {
      local_50 = 0.0;
      for (uVar5 = 0; n_density != uVar5; uVar5 = uVar5 + 1) {
        local_50 = local_50 + (double)(float)mixw[uVar4][uVar3][uVar5];
      }
      printf("mixw [%u %u] %e\n",(ulong)uVar7,uVar3 & 0xffffffff);
      dVar8 = 1.0;
      if ((((int)local_38 != 0) && (dVar8 = local_50, local_50 == 0.0)) && (!NAN(local_50))) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
                ,0x1d5,"mixw [%u][%u][*] zero\n",(ulong)uVar7,uVar3 & 0xffffffff);
        dVar8 = 1.0;
      }
      local_50 = dVar8;
      for (uVar5 = 0; uVar5 < n_density; uVar5 = uVar5 + 1) {
        if ((uVar5 & 7) == 0) {
          printf("\n\t");
        }
        printf(e_fmt,(double)(float)mixw[uVar4][uVar3][uVar5] / local_50);
      }
      putchar(10);
    }
  }
  return 0;
}

Assistant:

int
print_mixw(const char *fn)
{
    float32 ***mixw;
    uint32 n_mixw;
    uint32 mixw_s = NO_ID;
    uint32 mixw_e = NO_ID;
    uint32 n_feat;
    uint32 n_density;
    uint32 i, p_i, j, k;
    int32 normalize = cmd_ln_int32("-norm");
    float64 sum;

    E_INFO("Reading %s%s\n",
	   fn, (normalize ? "and normalizing." : "."));

    if (cmd_ln_str("-mixws")) {
	mixw_s = cmd_ln_int32("-mixws");
    }
    if (cmd_ln_str("-mixwe")) {
	mixw_e = cmd_ln_int32("-mixwe");
    }
    if (mixw_s == NO_ID && mixw_e == NO_ID) {
	if (s3mixw_read(fn,
			&mixw,
			&n_mixw,
			&n_feat,
			&n_density) != S3_SUCCESS) {
	    return S3_ERROR;
	}
	printf("mixw %u %u %u\n", n_mixw, n_feat, n_density);
    }
    else {
	if (s3mixw_intv_read(fn,
			     mixw_s,
			     mixw_e,
			     &mixw,
			     &n_mixw,
			     &n_feat,
			     &n_density) != S3_SUCCESS) {
	    return S3_ERROR;
	}
	printf("mixw %u %u %u subinterval [%u %u]\n",
	       n_mixw, n_feat, n_density, mixw_s, mixw_e);
    }


    for (i = 0; i < n_mixw; i++) {
	if (mixw_s != NO_ID)
	    p_i = i + mixw_s;
	else
	    p_i = i;

	for (j = 0; j < n_feat; j++) {
	    for (k = 0, sum = 0; k < n_density; k++) {
		sum += mixw[i][j][k];
	    }
		
	    printf("mixw [%u %u] %e\n", p_i, j, sum);

	    if (normalize) {
		if (sum == 0) {
		    E_WARN("mixw [%u][%u][*] zero\n", p_i, j);
		    sum = 1;
		}
	    }
	    else
		sum = 1;

	    for (k = 0; k < n_density; k++) {
		if ((k % 8) == 0)
		    printf("\n\t");
		printf(e_fmt, mixw[i][j][k]/sum);
	    }
	    printf("\n");
	}
    }
    return S3_SUCCESS;
}